

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoblend.h
# Opt level: O2

string * pzgeom::TPZGeoBlend<pzgeom::TPZGeoTriangle>::TypeName_abi_cxx11_(void)

{
  string *in_RDI;
  
  TPZGeoTriangle::TypeName_abi_cxx11_();
  return in_RDI;
}

Assistant:

static std::string TypeName() { return TGeo::TypeName(); }